

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qimage.cpp
# Opt level: O0

void __thiscall QImage::applyColorTransform(QImage *this,QColorTransform *transform)

{
  bool bVar1;
  ColorModel CVar2;
  QRgb QVar3;
  Format format;
  int iVar4;
  Format FVar5;
  Format FVar6;
  qsizetype qVar7;
  reference puVar8;
  QImage *this_00;
  int *piVar9;
  function<void_(int,_int)> *functionToRun;
  ulong uVar10;
  QColorTransform *in_RSI;
  QImage *in_RDI;
  long in_FS_OFFSET;
  int yn;
  int i_1;
  int y;
  QThreadPool *threadPool;
  Format oldFormat;
  int i;
  QSemaphore semaphore;
  int segments;
  function<void_(int,_int)> transformSegment;
  TransformFlags flags;
  undefined4 in_stack_fffffffffffffe18;
  undefined2 in_stack_fffffffffffffe1c;
  TransformModel in_stack_fffffffffffffe1e;
  ColorModel in_stack_fffffffffffffe1f;
  ColorModel in_stack_fffffffffffffe20;
  int in_stack_fffffffffffffe24;
  function<void_(int,_int)> *in_stack_fffffffffffffe28;
  QMessageLogger *in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe38;
  QRgb in_stack_fffffffffffffe3c;
  QColorTransform *this_01;
  QFlagsStorage<Qt::ImageConversionFlag> in_stack_fffffffffffffe4c;
  byte local_199;
  int local_188;
  int local_174;
  undefined1 *local_128;
  int local_120;
  int local_11c [5];
  undefined4 *local_108;
  undefined4 *local_f0;
  undefined4 *local_d8;
  undefined4 *local_c0;
  undefined4 *local_a8;
  undefined4 *local_90;
  undefined1 *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  undefined4 local_64;
  undefined4 local_60;
  undefined4 local_5c [5];
  quint64 local_48;
  QDebug local_20;
  quint64 local_18;
  quint64 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QColorTransform::isIdentity
                    ((QColorTransform *)
                     CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
  if (bVar1) goto LAB_002ca00a;
  local_10 = (quint64)pixelFormat((QImage *)
                                  CONCAT17(in_stack_fffffffffffffe1f,
                                           CONCAT16(in_stack_fffffffffffffe1e,
                                                    CONCAT24(in_stack_fffffffffffffe1c,
                                                             in_stack_fffffffffffffe18))));
  QPixelFormat::colorModel((QPixelFormat *)0x2c97aa);
  QColorTransformPrivate::get((QColorTransform *)0x2c97b8);
  QExplicitlySharedDataPointer<const_QColorSpacePrivate>::operator->
            ((QExplicitlySharedDataPointer<const_QColorSpacePrivate> *)0x2c97c4);
  bVar1 = qt_compatibleColorModelSource(in_stack_fffffffffffffe20,in_stack_fffffffffffffe1f);
  local_199 = 1;
  if (bVar1) {
    local_18 = (quint64)pixelFormat((QImage *)
                                    CONCAT17(in_stack_fffffffffffffe1f,
                                             CONCAT16(in_stack_fffffffffffffe1e,
                                                      CONCAT24(in_stack_fffffffffffffe1c,
                                                               in_stack_fffffffffffffe18))));
    QPixelFormat::colorModel((QPixelFormat *)0x2c97ff);
    QColorTransformPrivate::get((QColorTransform *)0x2c980d);
    QExplicitlySharedDataPointer<const_QColorSpacePrivate>::operator->
              ((QExplicitlySharedDataPointer<const_QColorSpacePrivate> *)0x2c9819);
    QColorTransformPrivate::get((QColorTransform *)0x2c982a);
    QExplicitlySharedDataPointer<const_QColorSpacePrivate>::operator->
              ((QExplicitlySharedDataPointer<const_QColorSpacePrivate> *)0x2c9836);
    bVar1 = qt_compatibleColorModelTarget
                      (in_stack_fffffffffffffe20,in_stack_fffffffffffffe1f,in_stack_fffffffffffffe1e
                      );
    local_199 = bVar1 ^ 0xff;
  }
  if ((local_199 & 1) != 0) {
    QMessageLogger::QMessageLogger
              (in_stack_fffffffffffffe30,(char *)in_stack_fffffffffffffe28,in_stack_fffffffffffffe24
               ,(char *)CONCAT17(in_stack_fffffffffffffe1f,
                                 CONCAT16(in_stack_fffffffffffffe1e,
                                          CONCAT24(in_stack_fffffffffffffe1c,
                                                   in_stack_fffffffffffffe18))));
    QMessageLogger::warning();
    QDebug::operator<<((QDebug *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                       (char *)in_RDI);
    QDebug::~QDebug(&local_20);
    goto LAB_002ca00a;
  }
  detach((QImage *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
  if (in_RDI->d == (QImageData *)0x0) goto LAB_002ca00a;
  local_48 = (quint64)pixelFormat((QImage *)
                                  CONCAT17(in_stack_fffffffffffffe1f,
                                           CONCAT16(in_stack_fffffffffffffe1e,
                                                    CONCAT24(in_stack_fffffffffffffe1c,
                                                             in_stack_fffffffffffffe18))));
  CVar2 = QPixelFormat::colorModel((QPixelFormat *)0x2c98e5);
  if (CVar2 == Indexed) {
    for (local_174 = 0; qVar7 = QList<unsigned_int>::size(&in_RDI->d->colortable), local_174 < qVar7
        ; local_174 = local_174 + 1) {
      this_01 = in_RSI;
      QList<unsigned_int>::operator[]
                ((QList<unsigned_int> *)
                 CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                 CONCAT17(in_stack_fffffffffffffe1f,
                          CONCAT16(in_stack_fffffffffffffe1e,
                                   CONCAT24(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18))));
      QVar3 = QColorTransform::map(this_01,in_stack_fffffffffffffe3c);
      puVar8 = QList<unsigned_int>::operator[]
                         ((QList<unsigned_int> *)
                          CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                          CONCAT17(in_stack_fffffffffffffe1f,
                                   CONCAT16(in_stack_fffffffffffffe1e,
                                            CONCAT24(in_stack_fffffffffffffe1c,
                                                     in_stack_fffffffffffffe18))));
      *puVar8 = QVar3;
    }
    goto LAB_002ca00a;
  }
  format = QImage::format(in_RDI);
  bVar1 = qt_fpColorPrecision(format);
  if (bVar1) {
    if (((format != Format_RGBX32FPx4) && (format != Format_RGBA32FPx4)) &&
       (format != Format_RGBA32FPx4_Premultiplied)) {
      QFlags<Qt::ImageConversionFlag>::QFlags
                ((QFlags<Qt::ImageConversionFlag> *)
                 CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                 CONCAT13(in_stack_fffffffffffffe1f,
                          CONCAT12(in_stack_fffffffffffffe1e,in_stack_fffffffffffffe1c)));
      convertTo((QImage *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                CONCAT13(in_stack_fffffffffffffe1f,
                         CONCAT12(in_stack_fffffffffffffe1e,in_stack_fffffffffffffe1c)),
                (ImageConversionFlags)in_stack_fffffffffffffe4c.i);
    }
  }
  else {
    iVar4 = depth(in_RDI);
    if (iVar4 < 0x21) {
      if ((((format != Format_ARGB32) && (format != Format_RGB32)) &&
          ((format != Format_ARGB32_Premultiplied &&
           ((format != Format_CMYK8888 && (format != Format_Grayscale8)))))) &&
         (format != Format_Grayscale16)) {
        bVar1 = hasAlphaChannel((QImage *)in_stack_fffffffffffffe28);
        if (bVar1) {
          QFlags<Qt::ImageConversionFlag>::QFlags
                    ((QFlags<Qt::ImageConversionFlag> *)
                     CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                     CONCAT13(in_stack_fffffffffffffe1f,
                              CONCAT12(in_stack_fffffffffffffe1e,in_stack_fffffffffffffe1c)));
          convertTo((QImage *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                    CONCAT13(in_stack_fffffffffffffe1f,
                             CONCAT12(in_stack_fffffffffffffe1e,in_stack_fffffffffffffe1c)),
                    (ImageConversionFlags)in_stack_fffffffffffffe4c.i);
        }
        else {
          QFlags<Qt::ImageConversionFlag>::QFlags
                    ((QFlags<Qt::ImageConversionFlag> *)
                     CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                     CONCAT13(in_stack_fffffffffffffe1f,
                              CONCAT12(in_stack_fffffffffffffe1e,in_stack_fffffffffffffe1c)));
          convertTo((QImage *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                    CONCAT13(in_stack_fffffffffffffe1f,
                             CONCAT12(in_stack_fffffffffffffe1e,in_stack_fffffffffffffe1c)),
                    (ImageConversionFlags)in_stack_fffffffffffffe4c.i);
        }
      }
    }
    else if (((format != Format_RGBX64) && (format != Format_RGBA64)) &&
            (format != Format_RGBA64_Premultiplied)) {
      QFlags<Qt::ImageConversionFlag>::QFlags
                ((QFlags<Qt::ImageConversionFlag> *)
                 CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                 CONCAT13(in_stack_fffffffffffffe1f,
                          CONCAT12(in_stack_fffffffffffffe1e,in_stack_fffffffffffffe1c)));
      convertTo((QImage *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                CONCAT13(in_stack_fffffffffffffe1f,
                         CONCAT12(in_stack_fffffffffffffe1e,in_stack_fffffffffffffe1c)),
                (ImageConversionFlags)in_stack_fffffffffffffe4c.i);
    }
  }
  local_5c[0] = 0xaaaaaaaa;
  QFlags<QColorTransformPrivate::TransformFlag>::QFlags
            ((QFlags<QColorTransformPrivate::TransformFlag> *)
             CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
             CONCAT13(in_stack_fffffffffffffe1f,
                      CONCAT12(in_stack_fffffffffffffe1e,in_stack_fffffffffffffe1c)));
  FVar5 = QImage::format(in_RDI);
  if (FVar5 == Format_RGB32) {
LAB_002c9b8e:
    QFlags<QColorTransformPrivate::TransformFlag>::QFlags
              ((QFlags<QColorTransformPrivate::TransformFlag> *)
               CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
               CONCAT13(in_stack_fffffffffffffe1f,
                        CONCAT12(in_stack_fffffffffffffe1e,in_stack_fffffffffffffe1c)));
    local_5c[0] = local_64;
  }
  else if (FVar5 != Format_ARGB32) {
    if (FVar5 == Format_ARGB32_Premultiplied) {
LAB_002c9b6c:
      QFlags<QColorTransformPrivate::TransformFlag>::QFlags
                ((QFlags<QColorTransformPrivate::TransformFlag> *)
                 CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                 CONCAT13(in_stack_fffffffffffffe1f,
                          CONCAT12(in_stack_fffffffffffffe1e,in_stack_fffffffffffffe1c)));
      local_5c[0] = local_60;
    }
    else {
      if (FVar5 - Format_Grayscale8 < 2) goto LAB_002c9b8e;
      if (FVar5 != Format_RGBA64) {
        if (FVar5 == Format_RGBA64_Premultiplied) goto LAB_002c9b6c;
        if ((FVar5 == Format_Grayscale16) || (FVar5 == Format_RGBX32FPx4)) goto LAB_002c9b8e;
        if (FVar5 != Format_RGBA32FPx4) {
          if (FVar5 == Format_RGBA32FPx4_Premultiplied) goto LAB_002c9b6c;
          if (FVar5 == Format_CMYK8888) goto LAB_002c9b8e;
        }
      }
    }
  }
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  local_80 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  local_70 = &DAT_aaaaaaaaaaaaaaaa;
  std::function<void_(int,_int)>::function
            ((function<void_(int,_int)> *)
             CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
  FVar5 = QImage::format(in_RDI);
  if (FVar5 == Format_Grayscale8) {
    local_90 = local_5c;
    std::function<void(int,int)>::operator=
              (in_stack_fffffffffffffe28,
               (anon_class_24_3_f0e105ae *)
               CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
  }
  else {
    FVar5 = QImage::format(in_RDI);
    if (FVar5 == Format_Grayscale16) {
      local_a8 = local_5c;
      std::function<void(int,int)>::operator=
                (in_stack_fffffffffffffe28,
                 (anon_class_24_3_f0e105ae *)
                 CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
    }
    else {
      FVar5 = QImage::format(in_RDI);
      bVar1 = qt_fpColorPrecision(FVar5);
      if (bVar1) {
        local_c0 = local_5c;
        std::function<void(int,int)>::operator=
                  (in_stack_fffffffffffffe28,
                   (anon_class_24_3_f0e105ae *)
                   CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
      }
      else {
        iVar4 = depth(in_RDI);
        if (iVar4 < 0x21) {
          if (format == Format_CMYK8888) {
            local_f0 = local_5c;
            std::function<void(int,int)>::operator=
                      (in_stack_fffffffffffffe28,
                       (anon_class_24_3_f0e105ae *)
                       CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
          }
          else {
            local_108 = local_5c;
            std::function<void(int,int)>::operator=
                      (in_stack_fffffffffffffe28,
                       (anon_class_24_3_f0e105ae *)
                       CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
          }
        }
        else {
          local_d8 = local_5c;
          std::function<void(int,int)>::operator=
                    (in_stack_fffffffffffffe28,
                     (anon_class_24_3_f0e105ae *)
                     CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
        }
      }
    }
  }
  iVar4 = width(in_RDI);
  this_00 = (QImage *)(long)iVar4;
  iVar4 = height(in_RDI);
  local_11c[0] = (int)((ulong)((long)this_00 * (long)iVar4) >> 0x10);
  local_120 = height(in_RDI);
  piVar9 = std::min<int>(local_11c,&local_120);
  local_11c[0] = *piVar9;
  functionToRun = (function<void_(int,_int)> *)QGuiApplicationPrivate::qtGuiThreadPool();
  if ((local_11c[0] < 2) || (functionToRun == (function<void_(int,_int)> *)0x0)) {
LAB_002c9f73:
    functionToRun = in_stack_fffffffffffffe28;
    height(in_RDI);
    std::function<void_(int,_int)>::operator()
              ((function<void_(int,_int)> *)
               CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
               (int)((ulong)functionToRun >> 0x20),(int)functionToRun);
  }
  else {
    QThread::currentThread();
    uVar10 = QThreadPool::contains((QThread *)functionToRun);
    in_stack_fffffffffffffe28 = functionToRun;
    if ((uVar10 & 1) != 0) goto LAB_002c9f73;
    local_128 = &DAT_aaaaaaaaaaaaaaaa;
    QSemaphore::QSemaphore((QSemaphore *)&local_128,0);
    for (local_188 = 0; local_188 < local_11c[0]; local_188 = local_188 + 1) {
      height(in_RDI);
      QThreadPool::
      start<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qt[P]qtbase_src_gui_image_qimage_cpp:5349:31),_true>
                ((QThreadPool *)this_00,(anon_class_24_4_fe1d2add_for_o *)functionToRun,
                 in_stack_fffffffffffffe24);
    }
    QSemaphore::acquire((int)&local_128);
    QSemaphore::~QSemaphore((QSemaphore *)&local_128);
  }
  FVar5 = format;
  FVar6 = QImage::format(in_RDI);
  if (FVar5 != FVar6) {
    QFlags<Qt::ImageConversionFlag>::QFlags
              ((QFlags<Qt::ImageConversionFlag> *)CONCAT44(FVar5,format),
               CONCAT13(in_stack_fffffffffffffe1f,
                        CONCAT12(in_stack_fffffffffffffe1e,in_stack_fffffffffffffe1c)));
    convertToFormat(this_00,(Format)((ulong)functionToRun >> 0x20),
                    (ImageConversionFlags)in_stack_fffffffffffffe4c.i);
    operator=((QImage *)functionToRun,(QImage *)CONCAT44(FVar5,format));
    ~QImage((QImage *)CONCAT44(FVar5,format));
  }
  std::function<void_(int,_int)>::~function((function<void_(int,_int)> *)0x2ca00a);
LAB_002ca00a:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QImage::applyColorTransform(const QColorTransform &transform)
{
    if (transform.isIdentity())
        return;

    if (!qt_compatibleColorModelSource(pixelFormat().colorModel(), QColorTransformPrivate::get(transform)->colorSpaceIn->colorModel) ||
        !qt_compatibleColorModelTarget(pixelFormat().colorModel(), QColorTransformPrivate::get(transform)->colorSpaceOut->colorModel,
                                       QColorTransformPrivate::get(transform)->colorSpaceOut->transformModel)) {
        qWarning() << "QImage::applyColorTransform can not apply format switching transform without switching format";
        return;
    }

    detach();
    if (!d)
        return;
    if (pixelFormat().colorModel() == QPixelFormat::Indexed) {
        for (int i = 0; i < d->colortable.size(); ++i)
            d->colortable[i] = transform.map(d->colortable[i]);
        return;
    }
    QImage::Format oldFormat = format();
    if (qt_fpColorPrecision(oldFormat)) {
        if (oldFormat != QImage::Format_RGBX32FPx4 && oldFormat != QImage::Format_RGBA32FPx4
                && oldFormat != QImage::Format_RGBA32FPx4_Premultiplied)
            convertTo(QImage::Format_RGBA32FPx4);
    } else if (depth() > 32) {
        if (oldFormat != QImage::Format_RGBX64 && oldFormat != QImage::Format_RGBA64
                && oldFormat != QImage::Format_RGBA64_Premultiplied)
            convertTo(QImage::Format_RGBA64);
    } else if (oldFormat != QImage::Format_ARGB32 && oldFormat != QImage::Format_RGB32
                && oldFormat != QImage::Format_ARGB32_Premultiplied && oldFormat != QImage::Format_CMYK8888
                && oldFormat != QImage::Format_Grayscale8 && oldFormat != QImage::Format_Grayscale16) {
        if (hasAlphaChannel())
            convertTo(QImage::Format_ARGB32);
        else
            convertTo(QImage::Format_RGB32);
    }

    QColorTransformPrivate::TransformFlags flags = QColorTransformPrivate::Unpremultiplied;
    switch (format()) {
    case Format_ARGB32_Premultiplied:
    case Format_RGBA64_Premultiplied:
    case Format_RGBA32FPx4_Premultiplied:
        flags = QColorTransformPrivate::Premultiplied;
        break;
    case Format_Grayscale8:
    case Format_Grayscale16:
    case Format_RGB32:
    case Format_CMYK8888:
    case Format_RGBX64:
    case Format_RGBX32FPx4:
        flags = QColorTransformPrivate::InputOpaque;
        break;
    case Format_ARGB32:
    case Format_RGBA64:
    case Format_RGBA32FPx4:
        break;
    default:
        Q_UNREACHABLE();
    }

    std::function<void(int,int)> transformSegment;

    if (format() == Format_Grayscale8) {
        transformSegment = [&](int yStart, int yEnd) {
            for (int y = yStart; y < yEnd; ++y) {
                uint8_t *scanline = reinterpret_cast<uint8_t *>(d->data + y * d->bytes_per_line);
                QColorTransformPrivate::get(transform)->apply(scanline, scanline, width(), flags);
            }
        };
    } else if (format() == Format_Grayscale16) {
        transformSegment = [&](int yStart, int yEnd) {
            for (int y = yStart; y < yEnd; ++y) {
                uint16_t *scanline = reinterpret_cast<uint16_t *>(d->data + y * d->bytes_per_line);
                QColorTransformPrivate::get(transform)->apply(scanline, scanline, width(), flags);
            }
        };
    } else if (qt_fpColorPrecision(format())) {
        transformSegment = [&](int yStart, int yEnd) {
            for (int y = yStart; y < yEnd; ++y) {
                QRgbaFloat32 *scanline = reinterpret_cast<QRgbaFloat32 *>(d->data + y * d->bytes_per_line);
                QColorTransformPrivate::get(transform)->apply(scanline, scanline, width(), flags);
            }
        };
    } else  if (depth() > 32) {
        transformSegment = [&](int yStart, int yEnd) {
            for (int y = yStart; y < yEnd; ++y) {
                QRgba64 *scanline = reinterpret_cast<QRgba64 *>(d->data + y * d->bytes_per_line);
                QColorTransformPrivate::get(transform)->apply(scanline, scanline, width(), flags);
            }
        };
    } else if (oldFormat == QImage::Format_CMYK8888) {
        transformSegment = [&](int yStart, int yEnd) {
            for (int y = yStart; y < yEnd; ++y) {
                QCmyk32 *scanline = reinterpret_cast<QCmyk32 *>(d->data + y * d->bytes_per_line);
                QColorTransformPrivate::get(transform)->apply(scanline, scanline, width(), flags);
            }
        };
    } else {
        transformSegment = [&](int yStart, int yEnd) {
            for (int y = yStart; y < yEnd; ++y) {
                QRgb *scanline = reinterpret_cast<QRgb *>(d->data + y * d->bytes_per_line);
                QColorTransformPrivate::get(transform)->apply(scanline, scanline, width(), flags);
            }
        };
    }

#if QT_CONFIG(qtgui_threadpool)
    int segments = (qsizetype(width()) * height()) >> 16;
    segments = std::min(segments, height());
    QThreadPool *threadPool = QGuiApplicationPrivate::qtGuiThreadPool();
    if (segments > 1 && threadPool && !threadPool->contains(QThread::currentThread())) {
        QSemaphore semaphore;
        int y = 0;
        for (int i = 0; i < segments; ++i) {
            int yn = (height() - y) / (segments - i);
            threadPool->start([&, y, yn]() {
                transformSegment(y, y + yn);
                semaphore.release(1);
            });
            y += yn;
        }
        semaphore.acquire(segments);
    } else
#endif
        transformSegment(0, height());

    if (oldFormat != format())
        *this = std::move(*this).convertToFormat(oldFormat);
}